

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O2

void Am_Text_Interim_Do_proc
               (Am_Object *inter,int mouse_x,int mouse_y,Am_Object *ref_obj,Am_Input_Char ic)

{
  Am_Text_Edit_Method_Type *pAVar1;
  bool bVar2;
  Am_Text_Abort_Or_Stop_Code AVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ostream *poVar6;
  Am_Object *pAVar7;
  uint uVar8;
  Am_Object text;
  Am_Text_Edit_Method text_edit_method;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  pAVar4 = Am_Object::Get(inter,0x16d,0);
  Am_Object::Am_Object(&text,pAVar4);
  if ((((uint)ic & 0xf00000) == 0x100000) && (uVar8 = (uint)ic >> 0x18 & 0xf, uVar8 != 0)) {
    Am_Point_In_Obj((Am_Object *)&text_edit_method,(int)&text,mouse_x,
                    (Am_Object *)(ulong)(uint)mouse_y);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&text_edit_method);
    Am_Object::~Am_Object((Am_Object *)&text_edit_method);
    if (pAVar5 != (Am_Wrapper *)0x0) {
      if (uVar8 == 1) {
LAB_001c8ff4:
        pAVar7 = &local_40;
        Am_Object::Am_Object(pAVar7,&text);
        move_text_cursor(pAVar7,mouse_x,mouse_y);
      }
      else {
        pAVar4 = Am_Object::Get(inter,0xe5,0);
        bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
        if (!bVar2) goto LAB_001c8ff4;
        Am_Object::Am_Object(&local_48,&text);
        Am_Set_Pending_Delete(&local_48,true);
        Am_Object::~Am_Object(&local_48);
        pAVar7 = &local_38;
        Am_Object::Am_Object(pAVar7,&text);
        Am_Set_Cut_Buffer_From_Text(pAVar7);
      }
      Am_Object::~Am_Object(pAVar7);
      goto LAB_001c901c;
    }
    AVar3 = am_check_text_legal(inter,&text);
    switch(AVar3) {
    case Am_TEXT_OK:
    case Am_TEXT_STOP_ANYWAY:
      pAVar4 = Am_Object::Get(inter,0x11c,0);
      bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
      Am_Object::Set(inter,300,(uint)bVar2,0);
      Am_Object::Set(inter,0x11c,true,0);
      Am_Object::Am_Object(&local_50,inter);
      Am_Object::Am_Object(&local_58,&text);
      bVar2 = text_has_been_edited(&local_50,&local_58);
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_50);
      if (bVar2) {
        pAVar4 = Am_Object::Get(inter,0xe6,1);
        Am_Value::Am_Value((Am_Value *)&text_edit_method,pAVar4);
        Am_Object::Set(inter,0xe6,0,0);
        Am_Object::Am_Object(&local_60,inter);
        Am_Object::Am_Object(&local_68,&text);
        Am_Object::Am_Object(&local_70,&Am_No_Object);
        Am_Stop_Interactor(&local_60,&local_68,ic,&local_70,0,0,true);
        Am_Object::~Am_Object(&local_70);
        Am_Object::~Am_Object(&local_68);
        Am_Object::~Am_Object(&local_60);
        bVar2 = Am_Value::Valid((Am_Value *)&text_edit_method);
        if (bVar2) {
          Am_Object::Set(inter,0xe6,(Am_Value *)&text_edit_method,0);
        }
        Am_Value::~Am_Value((Am_Value *)&text_edit_method);
        goto switchD_001c90ca_caseD_2;
      }
      Am_Object::Am_Object(&local_78,inter);
      Am_Abort_Interactor(&local_78,true);
      pAVar7 = &local_78;
      break;
    case Am_TEXT_ABORT_AND_RESTORE:
      Am_Object::Am_Object(&local_80,inter);
      Am_Abort_Interactor(&local_80,true);
      pAVar7 = &local_80;
      break;
    case Am_TEXT_KEEP_RUNNING:
      goto switchD_001c90ca_caseD_2;
    default:
      poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar6 = std::operator<<(poVar6,"Illegal code=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,AVar3);
      std::endl<char,std::char_traits<char>>(poVar6);
      Am_Error();
    }
  }
  else {
LAB_001c901c:
    text_edit_method.from_wrapper = (Am_Method_Wrapper *)0x0;
    text_edit_method.Call = (Am_Text_Edit_Method_Type *)0x0;
    pAVar4 = Am_Object::Get(inter,0xe3,0);
    Am_Text_Edit_Method::operator=(&text_edit_method,pAVar4);
    pAVar1 = text_edit_method.Call;
    Am_Object::Am_Object(&local_88,&text);
    Am_Object::Am_Object(&local_90,inter);
    (*pAVar1)((Am_Object_Data *)&local_88,ic,(Am_Object_Data *)&local_90);
    Am_Object::~Am_Object(&local_90);
    pAVar7 = &local_88;
  }
  Am_Object::~Am_Object(pAVar7);
switchD_001c90ca_caseD_2:
  Am_Object::~Am_Object(&text);
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void, Am_Text_Interim_Do,
                 (Am_Object inter, int mouse_x, int mouse_y, Am_Object ref_obj,
                  Am_Input_Char ic))
{
  Am_Object text = inter.Get(Am_OBJECT_MODIFIED);

  // move cursor if another mouse down event occurs in the OBJECT_MODIFIED.
  if ((ic.button_down == Am_BUTTON_DOWN) &&
      (static_cast<Am_Click_Count>(ic.click_count) >= Am_SINGLE_CLICK)) {
    if (Am_Point_In_Obj(text, mouse_x, mouse_y, ref_obj)) {
      if (static_cast<Am_Click_Count>(ic.click_count) >= Am_DOUBLE_CLICK &&
          (bool)inter.Get(Am_WANT_PENDING_DELETE)) {
        Am_Set_Pending_Delete(text, true);
        Am_Set_Cut_Buffer_From_Text(text);
      } else
        move_text_cursor(text, mouse_x, mouse_y);
    } else { // click outside the object, exit interactor, but save event
      //check to see if current value is valid first
      Am_Text_Abort_Or_Stop_Code code = am_check_text_legal(inter, text);
      switch (code) {
      case Am_TEXT_OK:
      case Am_TEXT_STOP_ANYWAY: {
        if ((bool)inter.Get(Am_RUN_ALSO))
          inter.Set(Am_REAL_RUN_ALSO, 1);
        else
          inter.Set(Am_REAL_RUN_ALSO, 0);
        inter.Set(Am_RUN_ALSO, true);
        //if the current string is different from the initial string, then call
        // stop_interactor, otherwise, abort the interactor (so stop
        // method not called if just clicking around)
        if (text_has_been_edited(inter, text)) {
          //stop the interactor, but make sure the stop doesn't call
          //the check again
          Am_Value old_method = inter.Peek(Am_TEXT_CHECK_LEGAL_METHOD);
          inter.Set(Am_TEXT_CHECK_LEGAL_METHOD, (0L));
          Am_Stop_Interactor(inter, text, ic);
          if (old_method.Valid())
            inter.Set(Am_TEXT_CHECK_LEGAL_METHOD, old_method);
        } else
          Am_Abort_Interactor(inter);
        return;
      }
      case Am_TEXT_KEEP_RUNNING:
        return; // just ignore this character
      case Am_TEXT_ABORT_AND_RESTORE:
        Am_Abort_Interactor(inter);
        return;
      default:
        Am_ERROR("Illegal code=" << (int)code);
      } //end switch
    }
  }
  Am_Text_Edit_Method text_edit_method;
  text_edit_method = inter.Get(Am_TEXT_EDIT_METHOD);
  text_edit_method.Call(text, ic, inter);
}